

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_tex_parameteriv(NegativeTestContext *ctx)

{
  allocator<char> local_3d;
  GLint params [1];
  string local_38;
  
  params[0] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not an accepted value.",&local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glGetTexParameteriv(&ctx->super_CallLogWrapper,0xffffffff,0x2800,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0xffffffff,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetTexParameteriv(&ctx->super_CallLogWrapper,0xffffffff,0xffffffff,params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_tex_parameteriv (NegativeTestContext& ctx)
{
	GLint params[1] = { 0 };

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetTexParameteriv (-1, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameteriv (GL_TEXTURE_2D, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameteriv (-1, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}